

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

int * Gia_ManHashFind(Gia_Man_t *p,int iLit0,int iLit1,int iLitC)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  Gia_Obj_t *pObj;
  char *__assertion;
  
  uVar1 = (p->vHTable).nSize;
  iVar2 = Abc_Lit2Var(iLit0);
  iVar3 = Abc_Lit2Var(iLit1);
  iVar4 = Abc_LitIsCompl(iLit0);
  iVar5 = Abc_LitIsCompl(iLit1);
  piVar6 = Vec_IntEntryP(&p->vHTable,
                         (uint)(iVar5 * 0x161 +
                               iVar4 * 0x38f + iVar3 * 0xb9b + iVar2 * 0x1f01 + iLitC * 0x7db) %
                         uVar1);
  if ((p->vHash).nSize == p->nObjs) {
    if ((iLit0 < iLit1) || (p->pMuxes != (uint *)0x0)) {
      if ((iLit0 < iLit1) ||
         ((iVar2 = Abc_LitIsCompl(iLit0), iVar2 == 0 && (iVar2 = Abc_LitIsCompl(iLit1), iVar2 == 0))
         )) {
        if ((iLitC == -1) || (iVar2 = Abc_LitIsCompl(iLit1), iVar2 == 0)) {
          do {
            iVar2 = *piVar6;
            if (iVar2 == 0) {
              return piVar6;
            }
            pObj = Gia_ManObj(p,iVar2);
            iVar3 = Gia_ObjFaninLit0(pObj,iVar2);
            if ((iVar3 == iLit0) && (iVar3 = Gia_ObjFaninLit1(pObj,iVar2), iVar3 == iLit1)) {
              if (p->pMuxes == (uint *)0x0) {
                return piVar6;
              }
              iVar3 = Gia_ObjFaninLit2p(p,pObj);
              if (iVar3 == iLitC) {
                return piVar6;
              }
            }
            piVar6 = Vec_IntEntryP(&p->vHash,iVar2);
          } while( true );
        }
        __assertion = "iLitC == -1 || !Abc_LitIsCompl(iLit1)";
        uVar1 = 0x3c;
      }
      else {
        __assertion = "iLit0 < iLit1 || (!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1))";
        uVar1 = 0x3b;
      }
    }
    else {
      __assertion = "p->pMuxes || iLit0 < iLit1";
      uVar1 = 0x3a;
    }
  }
  else {
    __assertion = "Vec_IntSize(&p->vHash) == Gia_ManObjNum(p)";
    uVar1 = 0x39;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                ,uVar1,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
}

Assistant:

static inline int * Gia_ManHashFind( Gia_Man_t * p, int iLit0, int iLit1, int iLitC )
{
    int iThis, * pPlace = Vec_IntEntryP( &p->vHTable, Gia_ManHashOne( iLit0, iLit1, iLitC, Vec_IntSize(&p->vHTable) ) );
    assert( Vec_IntSize(&p->vHash) == Gia_ManObjNum(p) );
    assert( p->pMuxes || iLit0 < iLit1 );
    assert( iLit0 < iLit1 || (!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1)) );
    assert( iLitC == -1 || !Abc_LitIsCompl(iLit1) );
    for ( ; (iThis = *pPlace); pPlace = Vec_IntEntryP(&p->vHash, iThis) )
    {
        Gia_Obj_t * pThis = Gia_ManObj( p, iThis );
        if ( Gia_ObjFaninLit0(pThis, iThis) == iLit0 && Gia_ObjFaninLit1(pThis, iThis) == iLit1 && (p->pMuxes == NULL || Gia_ObjFaninLit2p(p, pThis) == iLitC) )
            break;
    }
    return pPlace;
}